

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O0

void __thiscall
chrono::copter::Copter<6>::Copter
          (Copter<6> *this,ChSystem *sys,ChVector<double> *cpos,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *ppos,
          bool *clockwise,bool are_prop_pos_rel,bool z_up)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *pvVar2;
  element_type *peVar3;
  ChVector<double> *pCVar4;
  reference pvVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  double dVar9;
  ChVector<double> *local_3d0;
  shared_ptr<chrono::ChForce> local_360;
  ChVector<double> local_350;
  undefined1 local_338 [8];
  ChVector<double> tdir;
  undefined1 local_310 [8];
  shared_ptr<chrono::ChForce> backtorque;
  shared_ptr<chrono::ChForce> local_2e8;
  undefined1 local_2d8 [8];
  shared_ptr<chrono::ChForce> thrust;
  shared_ptr<chrono::ChFunction> local_2b8;
  undefined4 local_2a4;
  undefined1 local_2a0 [8];
  shared_ptr<chrono::ChFunction_Const> speed;
  shared_ptr<chrono::ChBodyFrame> local_208;
  shared_ptr<chrono::ChBodyFrame> local_1f8;
  ChVector<double> local_1e8;
  ChFrame<double> local_1d0;
  shared_ptr<chrono::ChBodyFrame> local_148;
  shared_ptr<chrono::ChBodyFrame> local_138;
  ChQuaternion<double> local_128;
  undefined1 local_108 [8];
  ChQuaternion<double> motor_rot;
  shared_ptr<chrono::ChLinkMotorRotationSpeed> propmot;
  ChVector<double> local_c8;
  ChVector<double> local_b0;
  undefined1 local_98 [8];
  shared_ptr<chrono::ChBody> prop;
  undefined1 local_80 [4];
  int p;
  ChVector<double> local_70;
  shared_ptr<chrono::ChBody> local_58 [2];
  byte local_32;
  byte local_31;
  bool z_up_local;
  bool *pbStack_30;
  bool are_prop_pos_rel_local;
  bool *clockwise_local;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *ppos_local;
  ChVector<double> *cpos_local;
  ChSystem *sys_local;
  Copter<6> *this_local;
  
  local_32 = z_up;
  this->_vptr_Copter = (_func_int **)&PTR_GetChassisMeshFilename_abi_cxx11__002ef850;
  local_31 = are_prop_pos_rel;
  pbStack_30 = clockwise;
  clockwise_local = (bool *)ppos;
  ppos_local = (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)cpos;
  cpos_local = (ChVector<double> *)sys;
  sys_local = (ChSystem *)this;
  std::shared_ptr<chrono::ChBody>::shared_ptr(&this->chassis);
  std::__cxx11::string::string((string *)&this->chassis_mesh_path);
  std::__cxx11::string::string((string *)&this->propeller_mesh_path);
  std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>::
  vector(&this->props);
  this->rho = 1.225;
  this->rho0 = 1.225;
  this->pressure = 101325.0;
  this->pressure0 = 101325.0;
  this->Temp0 = 298.0;
  this->Temp = 298.0;
  this->Altitude0 = 0.0;
  this->h0 = 0.0;
  ChVector<double>::ChVector(&this->up);
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::vector(&this->thrusts);
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::vector(&this->backtorques);
  std::
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ::vector(&this->motors);
  std::
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ::vector(&this->speeds);
  this->Cd = 0.0;
  std::shared_ptr<chrono::ChForce>::shared_ptr(&this->lin_drag);
  this->Surf = 0.0;
  if ((local_32 & 1) == 0) {
    local_3d0 = (ChVector<double> *)&VECT_Y;
  }
  else {
    local_3d0 = (ChVector<double> *)&VECT_Z;
  }
  ChVector<double>::operator=(&this->up,local_3d0);
  chrono_types::make_shared<chrono::ChBody,_0>();
  std::shared_ptr<chrono::ChBody>::operator=(&this->chassis,local_58);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(local_58);
  peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->chassis);
  ChFrame<double>::SetPos((ChFrame<double> *)(peVar3 + 0x78),(ChVector<double> *)ppos_local);
  peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->chassis);
  ChBody::SetMass(peVar3,10.0);
  peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->chassis);
  ChVector<double>::ChVector(&local_70,1.0,1.0,1.0);
  chrono::ChBody::SetInertiaXX(peVar3);
  peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->chassis);
  chrono::ChBody::SetBodyFixed(SUB81(peVar3,0));
  pCVar4 = cpos_local;
  std::shared_ptr<chrono::ChBody>::shared_ptr((shared_ptr<chrono::ChBody> *)local_80,&this->chassis)
  ;
  (**(code **)((long)pCVar4->m_data[0] + 0x128))(pCVar4,(shared_ptr<chrono::ChBody> *)local_80);
  std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)local_80);
  peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->chassis);
  pCVar4 = ChFrame<double>::GetPos((ChFrame<double> *)(peVar3 + 0x78));
  dVar9 = ChVector<double>::operator^(pCVar4,&this->up);
  this->h0 = dVar9;
  for (prop.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
            0; prop.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               ._4_4_ < 6;
      prop.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           prop.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _4_4_ + 1) {
    chrono_types::make_shared<chrono::ChBody,_0>();
    std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
    ::push_back(&this->props,(value_type *)local_98);
    if ((local_31 & 1) == 0) {
      peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_98);
      pvVar5 = std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
               operator[](ppos,(long)prop.
                                     super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi._4_4_);
      ChFrame<double>::SetPos((ChFrame<double> *)(peVar3 + 0x78),pvVar5);
    }
    else {
      peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_98);
      pvVar2 = ppos_local;
      pvVar5 = std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
               operator[](ppos,(long)prop.
                                     super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi._4_4_);
      ChVector<double>::operator+(&local_b0,(ChVector<double> *)pvVar2,pvVar5);
      ChFrame<double>::SetPos((ChFrame<double> *)(peVar3 + 0x78),&local_b0);
    }
    peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
    ChBody::SetMass(peVar3,1.0);
    peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
    ChVector<double>::ChVector(&local_c8,0.2,0.2,0.2);
    chrono::ChBody::SetInertiaXX(peVar3);
    peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
    chrono::ChBody::SetBodyFixed(SUB81(peVar3,0));
    pCVar4 = cpos_local;
    p_Var1 = &propmot.
              super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<chrono::ChBody>::shared_ptr
              ((shared_ptr<chrono::ChBody> *)p_Var1,(shared_ptr<chrono::ChBody> *)local_98);
    (**(code **)((long)pCVar4->m_data[0] + 0x128))(pCVar4,p_Var1);
    std::shared_ptr<chrono::ChBody>::~shared_ptr
              ((shared_ptr<chrono::ChBody> *)
               &propmot.
                super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono_types::make_shared<chrono::ChLinkMotorRotationSpeed,_0>();
    ChQuaternion<double>::ChQuaternion
              ((ChQuaternion<double> *)local_108,(ChQuaternion<double> *)&Q_ROTATE_Y_TO_Z);
    if ((local_32 & 1) != 0) {
      ChQuaternion<double>::operator=
                ((ChQuaternion<double> *)local_108,(ChQuaternion<double> *)&QUNIT);
    }
    if ((pbStack_30
         [prop.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_] & 1U) != 0) {
      ChQuaternion<double>::operator*
                (&local_128,(ChQuaternion<double> *)&Q_FLIP_AROUND_X,
                 (ChQuaternion<double> *)local_108);
      ChQuaternion<double>::operator=((ChQuaternion<double> *)local_108,&local_128);
    }
    if ((local_31 & 1) == 0) {
      peVar6 = std::
               __shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(motor_rot.m_data + 3));
      std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
                (&local_1f8,(shared_ptr<chrono::ChBody> *)local_98);
      std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
                (&local_208,&this->chassis);
      pvVar5 = std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
               operator[](ppos,(long)prop.
                                     super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi._4_4_);
      ChFrame<double>::ChFrame
                ((ChFrame<double> *)
                 &speed.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pvVar5,(ChQuaternion<double> *)local_108);
      (**(code **)(*(long *)peVar6 + 0x240))
                (peVar6,&local_1f8,&local_208,
                 &speed.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ChFrame<double>::~ChFrame
                ((ChFrame<double> *)
                 &speed.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_208);
      std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_1f8);
    }
    else {
      peVar6 = std::
               __shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(motor_rot.m_data + 3));
      std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
                (&local_138,(shared_ptr<chrono::ChBody> *)local_98);
      std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
                (&local_148,&this->chassis);
      pvVar2 = ppos_local;
      pvVar5 = std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
               operator[](ppos,(long)prop.
                                     super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi._4_4_);
      ChVector<double>::operator+(&local_1e8,(ChVector<double> *)pvVar2,pvVar5);
      ChFrame<double>::ChFrame(&local_1d0,&local_1e8,(ChQuaternion<double> *)local_108);
      (**(code **)(*(long *)peVar6 + 0x240))(peVar6,&local_138,&local_148,&local_1d0);
      ChFrame<double>::~ChFrame(&local_1d0);
      std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_148);
      std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_138);
    }
    local_2a4 = 0;
    chrono_types::make_shared<chrono::ChFunction_Const,_int,_0>((int *)local_2a0);
    peVar6 = std::
             __shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(motor_rot.m_data + 3));
    std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Const,void>
              (&local_2b8,(shared_ptr<chrono::ChFunction_Const> *)local_2a0);
    ChLinkMotorRotationSpeed::SetSpeedFunction(peVar6,&local_2b8);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_2b8);
    pCVar4 = cpos_local;
    p_Var1 = &thrust.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkMotorRotationSpeed,void>
              ((shared_ptr<chrono::ChLinkBase> *)p_Var1,
               (shared_ptr<chrono::ChLinkMotorRotationSpeed> *)(motor_rot.m_data + 3));
    (**(code **)((long)pCVar4->m_data[0] + 0x138))(pCVar4,p_Var1);
    std::shared_ptr<chrono::ChLinkBase>::~shared_ptr
              ((shared_ptr<chrono::ChLinkBase> *)
               &thrust.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
    ::push_back(&this->motors,(value_type *)(motor_rot.m_data + 3));
    std::
    vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
    ::push_back(&this->speeds,(value_type *)local_2a0);
    this->u_p[prop.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _4_4_] = 0.0;
    chrono_types::make_shared<chrono::ChForce,_0>();
    peVar7 = std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_2d8);
    peVar8 = std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)local_98);
    ChForce::SetBody(peVar7,peVar8);
    peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
    std::shared_ptr<chrono::ChForce>::shared_ptr
              (&local_2e8,(shared_ptr<chrono::ChForce> *)local_2d8);
    chrono::ChBody::AddForce(peVar3);
    std::shared_ptr<chrono::ChForce>::~shared_ptr(&local_2e8);
    peVar7 = std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_2d8);
    ChForce::SetMode(peVar7,FORCE);
    std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_2d8);
    chrono::ChForce::SetMforce(0.0);
    peVar7 = std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_2d8);
    ChVector<double>::ChVector
              ((ChVector<double> *)
               &backtorque.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&this->up);
    chrono::ChForce::SetRelDir
              (peVar7,&backtorque.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    push_back(&this->thrusts,(value_type *)local_2d8);
    std::make_shared<chrono::ChForce>();
    peVar7 = std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_310);
    peVar8 = std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)local_98);
    ChForce::SetBody(peVar7,peVar8);
    peVar3 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
    std::shared_ptr<chrono::ChForce>::shared_ptr
              ((shared_ptr<chrono::ChForce> *)(tdir.m_data + 2),
               (shared_ptr<chrono::ChForce> *)local_310);
    chrono::ChBody::AddForce(peVar3,tdir.m_data + 2);
    std::shared_ptr<chrono::ChForce>::~shared_ptr((shared_ptr<chrono::ChForce> *)(tdir.m_data + 2));
    peVar7 = std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_310);
    ChForce::SetMode(peVar7,TORQUE);
    std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_310);
    chrono::ChForce::SetMforce(0.0);
    if ((pbStack_30
         [prop.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_] & 1U) == 0) {
      ChVector<double>::operator-((ChVector<double> *)local_338,&this->up);
    }
    else {
      ChVector<double>::ChVector((ChVector<double> *)local_338,&this->up);
    }
    peVar7 = std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_310);
    ChVector<double>::ChVector(&local_350,(ChVector<double> *)local_338);
    chrono::ChForce::SetRelDir(peVar7,&local_350);
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    push_back(&this->backtorques,(value_type *)local_310);
    std::shared_ptr<chrono::ChForce>::~shared_ptr((shared_ptr<chrono::ChForce> *)local_310);
    std::shared_ptr<chrono::ChForce>::~shared_ptr((shared_ptr<chrono::ChForce> *)local_2d8);
    std::shared_ptr<chrono::ChFunction_Const>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_Const> *)local_2a0);
    std::shared_ptr<chrono::ChLinkMotorRotationSpeed>::~shared_ptr
              ((shared_ptr<chrono::ChLinkMotorRotationSpeed> *)(motor_rot.m_data + 3));
    std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)local_98);
  }
  std::make_shared<chrono::ChForce>();
  std::shared_ptr<chrono::ChForce>::operator=(&this->lin_drag,&local_360);
  std::shared_ptr<chrono::ChForce>::~shared_ptr(&local_360);
  peVar7 = std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->lin_drag);
  peVar8 = std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->chassis).
                       super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChForce::SetBody(peVar7,peVar8);
  peVar7 = std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->lin_drag);
  ChForce::SetMode(peVar7,FORCE);
  std::__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->lin_drag);
  chrono::ChForce::SetMforce(0.0);
  return;
}

Assistant:

Copter<nop>::Copter(ChSystem& sys,
                    const ChVector<>& cpos,
                    std::vector<ChVector<>> ppos,
                    const bool clockwise[],
                    bool are_prop_pos_rel,
                    bool z_up) {
    // TODO: ChBodyAuxRef here might be more convenient
    up = (z_up) ? VECT_Z : VECT_Y;
    chassis = chrono_types::make_shared<ChBody>();
    chassis->SetPos(cpos);
    // placeholder Data.
    chassis->SetMass(10);
    chassis->SetInertiaXX(ChVector<>(1, 1, 1));
    chassis->SetBodyFixed(false);
    sys.AddBody(chassis);
    h0 = chassis->GetPos() ^ up;
    // 26.4 inch propellers
    for (int p = 0; p < nop; p++) {
        auto prop = chrono_types::make_shared<ChBody>();
        props.push_back(prop);
        if (are_prop_pos_rel) {
            prop->SetPos(cpos + ppos[p]);
        } else {
            prop->SetPos(ppos[p]);
        }
        // Data from little hexy, page 132.
        prop->SetMass(1);
        prop->SetInertiaXX(ChVector<>(0.2, 0.2, 0.2));
        prop->SetBodyFixed(false);
        sys.AddBody(prop);

        auto propmot = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
        ChQuaternion<> motor_rot = Q_ROTATE_Y_TO_Z;
        if (z_up) {
            motor_rot = QUNIT;
        };
        if (clockwise[p]) {
            motor_rot = Q_FLIP_AROUND_X * motor_rot;
        };
        
        if (are_prop_pos_rel) {
            propmot->Initialize(prop, chassis, ChFrame<>(cpos + ppos[p], motor_rot)); 
        } else {
            propmot->Initialize(prop, chassis, ChFrame<>(ppos[p], motor_rot));
        }
        auto speed = chrono_types::make_shared<ChFunction_Const>(0);
        propmot->SetSpeedFunction(speed);
        sys.AddLink(propmot);

        motors.push_back(propmot);
        speeds.push_back(speed);

        u_p[p] = 0;
        auto thrust = chrono_types::make_shared<ChForce>();
        thrust->SetBody(prop.get());
        prop->AddForce(thrust);
        thrust->SetMode(ChForce::FORCE);
        thrust->SetMforce(0);
        thrust->SetRelDir(up);
        thrusts.push_back(thrust);

        auto backtorque = std::make_shared<ChForce>();
        backtorque->SetBody(prop.get());
        prop->AddForce(backtorque);
        backtorque->SetMode(ChForce::TORQUE);
        backtorque->SetMforce(0);
        // Resistance Torque direction opposed to omega
        ChVector<> tdir = (clockwise[p]) ? up : -up;
        backtorque->SetRelDir(tdir);
        backtorques.push_back(backtorque);
    }

    // linear drag on copter body
    lin_drag = std::make_shared<ChForce>();
    lin_drag->SetBody(chassis.get());
    lin_drag->SetMode(ChForce::FORCE);
    lin_drag->SetMforce(0);
}